

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

void __thiscall
cppcms::impl::details::basic_map<$7159f324$>::rehash(basic_map<_7159f324_> *this,size_t new_size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  container *in_RDI;
  range_type *r;
  iterator p;
  basic_map<_7159f324_> tmp;
  intrusive_list<_b487a5d2_> *in_stack_ffffffffffffff58;
  container *in_stack_ffffffffffffff60;
  basic_map<_7159f324_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  container *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  container *p_00;
  vector<_28565068_> *in_stack_ffffffffffffff90;
  container *local_60;
  container *local_58;
  pair<_e30d2ef0_> local_50;
  basic_map<_7159f324_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  this_00 = &local_40;
  local_10 = in_RSI;
  basic_map(this_00);
  local_58 = (container *)0x0;
  local_60 = (container *)0x0;
  std::pair<$e30d2ef0$>::pair<_e8d8dbf2_>(&local_50,&local_58,&local_60);
  std::vector<$28565068$>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (value_type *)in_stack_ffffffffffffff80);
  k = local_10;
  while (*(long *)((long)&(in_RDI->val).first.field_2 + 8) != 0) {
    p_00 = *(container **)((long)&(in_RDI->val).first.field_2 + 8);
    intrusive_list<$b487a5d2$>::erase
              ((intrusive_list<_b487a5d2_> *)((long)&(in_RDI->val).first.field_2 + 8),p_00);
    in_stack_ffffffffffffff60 =
         (container *)
         basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
         ::get<std::__cxx11::string>((basic_map<_7159f324_> *)in_stack_ffffffffffffff80,k);
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff60;
    if (*(long *)&(in_stack_ffffffffffffff60->val).first == 0) {
      intrusive_list<$b487a5d2$>::push_back(&local_40.list_,p_00);
      (in_stack_ffffffffffffff80->val).first._M_string_length = (size_type)p_00;
      *(container **)&(in_stack_ffffffffffffff80->val).first = p_00;
    }
    else {
      intrusive_list<$b487a5d2$>::insert_after
                ((intrusive_list<_b487a5d2_> *)this_00,in_RDI,in_stack_ffffffffffffff60);
      (in_stack_ffffffffffffff80->val).first._M_string_length = (size_type)p_00;
    }
  }
  intrusive_list<$b487a5d2$>::swap
            ((intrusive_list<_b487a5d2_> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::vector<$28565068$>::swap(&this_00->hash_,(vector<_28565068_> *)in_RDI);
  std::vector<$28565068$>::clear((vector<_28565068_> *)0x418433);
  ~basic_map((basic_map<_7159f324_> *)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void rehash(size_t new_size)
	{
		basic_map tmp;
		tmp.hash_.resize(new_size,range_type(iterator(),iterator()));
		while(list_.begin) {
			iterator p=list_.begin;
			list_.erase(p);
			range_type &r = tmp.get(p->val.first);
			if(r.first == 0) {
				tmp.list_.push_back(p);
				r.first = r.second = p;
			}
			else {
				tmp.list_.insert_after(p,r.second);
				r.second = p;
			}
		}
		list_.swap(tmp.list_);
		hash_.swap(tmp.hash_);
		tmp.hash_.clear();
	}